

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScene::setSelectionArea
          (QGraphicsScene *this,QPainterPath *path,ItemSelectionOperation selectionOperation,
          ItemSelectionMode mode,QTransform *deviceTransform)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  GraphicsItemFlags GVar6;
  long lVar7;
  bool bVar8;
  long lVar9;
  QHash<QGraphicsItem_*,_QHashDummyValue> QVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  QSet<QGraphicsItem_*> unselectItems;
  QGraphicsItem *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  QPainterPath::operator=((QPainterPath *)(lVar2 + 0x118),path);
  local_40.d = *(Data **)(lVar2 + 0x128);
  if ((local_40.d != (Data *)0x0) &&
     (((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
    LOCK();
    ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(int *)(lVar2 + 0x120) = *(int *)(lVar2 + 0x120) + 1;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x80))
            (&local_58,*(long **)(*(long *)(this + 8) + 0x88),path,mode,1,deviceTransform);
  if (local_48 == (undefined1 *)0x0) {
    bVar8 = false;
  }
  else {
    lVar3 = CONCAT44(uStack_4c,uStack_50);
    lVar9 = (long)local_48 << 3;
    lVar7 = 0;
    bVar8 = false;
    do {
      local_60 = *(QGraphicsItem **)(lVar3 + lVar7);
      GVar6 = QGraphicsItem::flags(local_60);
      if (((uint)GVar6.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                 super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i & 2) != 0) {
        bVar5 = QGraphicsItem::isSelected(local_60);
        if (!bVar5) {
          bVar8 = true;
        }
        QHash<QGraphicsItem*,QHashDummyValue>::removeImpl<QGraphicsItem*>
                  ((QHash<QGraphicsItem*,QHashDummyValue> *)&local_40,&local_60);
        QGraphicsItem::setSelected(local_60,true);
      }
      lVar7 = lVar7 + 8;
    } while (lVar9 != lVar7);
  }
  if (selectionOperation != ReplaceSelection) goto LAB_006129a1;
  if (local_40.d == (Data *)0x0) {
    QVar10.d = (Data *)0x0;
LAB_0061291f:
    uVar11 = 0;
  }
  else {
    QVar10.d = local_40.d;
    if ((local_40.d)->spans->offsets[0] != 0xff) goto LAB_0061291f;
    uVar4 = 1;
    do {
      uVar11 = uVar4;
      if ((local_40.d)->numBuckets == uVar11) {
        QVar10.d = (Data *)0x0;
        uVar11 = 0;
        break;
      }
      uVar4 = uVar11 + 1;
    } while ((local_40.d)->spans[uVar11 >> 7].offsets[(uint)uVar11 & 0x7f] == 0xff);
  }
  if (QVar10.d != (Data *)0x0 || uVar11 != 0) {
    do {
      QGraphicsItem::setSelected
                (*(QGraphicsItem **)
                  (QVar10.d)->spans[uVar11 >> 7].entries
                  [(QVar10.d)->spans[uVar11 >> 7].offsets[(uint)uVar11 & 0x7f]].storage.data,false);
      do {
        if ((QVar10.d)->numBuckets - 1 == uVar11) {
          QVar10.d = (Data *)0x0;
          uVar11 = 0;
          break;
        }
        uVar11 = uVar11 + 1;
      } while ((QVar10.d)->spans[uVar11 >> 7].offsets[(uint)uVar11 & 0x7f] == 0xff);
    } while ((QVar10.d != (Data *)0x0) || (uVar11 != 0));
    bVar8 = true;
  }
LAB_006129a1:
  piVar1 = (int *)(lVar2 + 0x120);
  *piVar1 = *piVar1 + -1;
  if ((*piVar1 == 0) && (bVar8)) {
    QMetaObject::activate((QObject *)this,&staticMetaObject,2,(void **)0x0);
  }
  piVar1 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),8,0x10);
    }
  }
  QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::setSelectionArea(const QPainterPath &path,
                                      Qt::ItemSelectionOperation selectionOperation,
                                      Qt::ItemSelectionMode mode,
                                      const QTransform &deviceTransform)
{
    Q_D(QGraphicsScene);

    // Note: with boolean path operations, we can improve performance here
    // quite a lot by "growing" the old path instead of replacing it. That
    // allows us to only check the intersect area for changes, instead of
    // reevaluating the whole path over again.
    d->selectionArea = path;

    QSet<QGraphicsItem *> unselectItems = d->selectedItems;

    // Disable emitting selectionChanged() for individual items.
    ++d->selectionChanging;
    bool changed = false;

    // Set all items in path to selected.
    const auto items = this->items(path, mode, Qt::DescendingOrder, deviceTransform);
    for (QGraphicsItem *item : items) {
        if (item->flags() & QGraphicsItem::ItemIsSelectable) {
            if (!item->isSelected())
                changed = true;
            unselectItems.remove(item);
            item->setSelected(true);
        }
    }

    switch (selectionOperation) {
    case Qt::ReplaceSelection:
        // Deselect all items outside path.
        for (QGraphicsItem *item : std::as_const(unselectItems)) {
            item->setSelected(false);
            changed = true;
        }
        break;
    default:
        break;
    }

    // Re-enable emitting selectionChanged() for individual items.
    --d->selectionChanging;

    if (!d->selectionChanging && changed)
        emit selectionChanged();
}